

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O3

void __thiscall ConditionalExecution::predefineDirectMulti(ConditionalExecution *this,PcodeOp *op)

{
  int iVar1;
  Funcdata *this_00;
  BlockBasic *pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  PcodeOp *op_00;
  Varnode *pVVar5;
  mapped_type *ppVVar6;
  int4 slot;
  int iVar7;
  Varnode *vn;
  int slot_00;
  Address local_40;
  
  this_00 = this->fd;
  pBVar2 = this->posta_block;
  pBVar3 = (pBVar2->super_FlowBlock).intothis.
           super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pBVar4 = (pBVar2->super_FlowBlock).intothis.
           super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.super__Vector_impl_data
           ._M_start;
  (*(pBVar2->super_FlowBlock)._vptr_FlowBlock[2])(&local_40);
  op_00 = Funcdata::newOp(this_00,(int)((ulong)((long)pBVar3 - (long)pBVar4) >> 3) * -0x55555555 + 1
                          ,&local_40);
  pVVar5 = Funcdata::newVarnodeOut(this->fd,op->output->size,&op->output->loc,op_00);
  Funcdata::opSetOpcode(this->fd,op_00,CPUI_MULTIEQUAL);
  slot = (int)((ulong)((long)(this->posta_block->super_FlowBlock).intothis.
                             super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->posta_block->super_FlowBlock).intothis.
                            super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  if (0 < slot) {
    iVar1 = (this->iblock->super_FlowBlock).outofthis.
            super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
            super__Vector_impl_data._M_start[this->posta_outslot].reverse_index;
    slot_00 = 0;
    do {
      vn = pVVar5;
      if (iVar1 == slot_00) {
        vn = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[1 - (long)this->camethruposta_slot];
      }
      Funcdata::opSetInput(this->fd,op_00,vn,slot_00);
      slot_00 = slot_00 + 1;
      iVar7 = (int)((ulong)((long)(this->posta_block->super_FlowBlock).intothis.
                                  super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->posta_block->super_FlowBlock).intothis.
                                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
      slot = iVar7 * -0x55555555;
    } while (SBORROW4(slot_00,slot) != slot_00 + iVar7 * 0x55555555 < 0);
  }
  Funcdata::opSetInput
            (this->fd,op_00,
             (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[this->camethruposta_slot],slot);
  Funcdata::opInsertBegin(this->fd,op_00,this->posta_block);
  local_40.base._0_4_ = (this->posta_block->super_FlowBlock).index;
  ppVVar6 = std::
            map<int,_Varnode_*,_std::less<int>,_std::allocator<std::pair<const_int,_Varnode_*>_>_>::
            operator[](&this->replacement,(key_type *)&local_40);
  *ppVVar6 = pVVar5;
  return;
}

Assistant:

void ConditionalExecution::predefineDirectMulti(PcodeOp *op)

{
  PcodeOp *newop = fd->newOp(posta_block->sizeIn()+1,posta_block->getStart());
  Varnode *outvn = op->getOut();
  Varnode *newoutvn;
  newoutvn = fd->newVarnodeOut(outvn->getSize(),outvn->getAddr(),newop);
  fd->opSetOpcode(newop,CPUI_MULTIEQUAL);
  Varnode *vn;
  int4 inslot = iblock->getOutRevIndex(posta_outslot);
  for(int4 i=0;i<posta_block->sizeIn();++i) {
    if (i==inslot)
      vn = op->getIn(1-camethruposta_slot);
    else
      vn = newoutvn;
    fd->opSetInput(newop,vn,i);
  }
  fd->opSetInput(newop,op->getIn(camethruposta_slot),posta_block->sizeIn());
  fd->opInsertBegin(newop,posta_block);

  // Cache this new data flow holder
  replacement[posta_block->getIndex()] = newoutvn;
}